

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clickrem.c
# Opt level: O2

void dumb_record_click(DUMB_CLICK_REMOVER *cr,int32 pos,sample_t_conflict step)

{
  DUMB_CLICK *click;
  DUMB_CLICK *pDVar1;
  
  if (step != 0 && cr != (DUMB_CLICK_REMOVER *)0x0) {
    if (pos == 0) {
      cr->offset = cr->offset - step;
    }
    else {
      pDVar1 = cr->free_clicks;
      if (pDVar1 == (DUMB_CLICK *)0x0) {
        pDVar1 = (DUMB_CLICK *)malloc(0x10);
        if (pDVar1 == (DUMB_CLICK *)0x0) {
          return;
        }
      }
      else {
        cr->free_clicks = pDVar1->next;
      }
      pDVar1->pos = pos;
      pDVar1->step = step;
      pDVar1->next = cr->click;
      cr->click = pDVar1;
      cr->n_clicks = cr->n_clicks + 1;
    }
  }
  return;
}

Assistant:

void DUMBEXPORT dumb_record_click(DUMB_CLICK_REMOVER *cr, int32 pos, sample_t step)
{
	DUMB_CLICK *click;

	ASSERT(pos >= 0);

	if (!cr || !step) return;

	if (pos == 0) {
		cr->offset -= step;
		return;
	}

	click = alloc_click(cr);
	if (!click) return;

	click->pos = pos;
	click->step = step;

	click->next = cr->click;
	cr->click = click;
	cr->n_clicks++;
}